

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O1

void __thiscall setup::windows_version::data::load(data *this,istream *is,version *version)

{
  uint uVar1;
  char buffer_1 [1];
  char buffer_2 [1];
  char buffer [2];
  byte local_1c;
  byte local_1b;
  ushort local_1a;
  
  uVar1 = 0;
  if (0x10312ff < version->value) {
    std::istream::read((char *)is,(long)&local_1a);
    uVar1 = (uint)local_1a;
  }
  this->build = uVar1;
  std::istream::read((char *)is,(long)&local_1c);
  this->minor = (uint)local_1c;
  std::istream::read((char *)is,(long)&local_1b);
  this->major = (uint)local_1b;
  return;
}

Assistant:

void windows_version::data::load(std::istream & is, const version & version) {
	
	if(version >= INNO_VERSION(1, 3, 19)) {
		build = util::load<boost::uint16_t>(is);
	} else {
		build = 0;
	}
	
	minor = util::load<boost::uint8_t>(is);
	major = util::load<boost::uint8_t>(is);
	
}